

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O0

CURLcode hsts_push(Curl_easy *data,curl_index *i,stsentry *sts,_Bool *stop)

{
  CURLcode CVar1;
  CURLSTScode CVar2;
  undefined1 local_98 [4];
  CURLcode result;
  tm stamp;
  undefined1 auStack_58 [4];
  CURLSTScode sc;
  curl_hstsentry e;
  _Bool *stop_local;
  stsentry *sts_local;
  curl_index *i_local;
  Curl_easy *data_local;
  
  _auStack_58 = sts->host;
  e._32_8_ = stop;
  e.name = (char *)strlen(sts->host);
  e.namelen._0_1_ = (byte)e.namelen & 0xfe | sts->includeSubDomains & 1U;
  if (sts->expires == 0x7fffffffffffffff) {
    strcpy((char *)((long)&e.namelen + 1),"unlimited");
  }
  else {
    CVar1 = Curl_gmtime(sts->expires,(tm *)local_98);
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    curl_msnprintf((char *)((long)&e.namelen + 1),0x12,"%d%02d%02d %02d:%02d:%02d",
                   (ulong)(stamp.tm_mday + 0x76c),(ulong)(stamp.tm_hour + 1),
                   (ulong)(uint)stamp.tm_min,stamp.tm_sec,result,local_98);
  }
  CVar2 = (*(data->set).hsts_write)
                    (data,(curl_hstsentry *)auStack_58,i,(data->set).hsts_write_userp);
  *(bool *)e._32_8_ = CVar2 != CURLSTS_OK;
  data_local._4_4_ = CURLE_OK;
  if (CVar2 == CURLSTS_FAIL) {
    data_local._4_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode hsts_push(struct Curl_easy *data,
                          struct curl_index *i,
                          struct stsentry *sts,
                          bool *stop)
{
  struct curl_hstsentry e;
  CURLSTScode sc;
  struct tm stamp;
  CURLcode result;

  e.name = (char *)sts->host;
  e.namelen = strlen(sts->host);
  e.includeSubDomains = sts->includeSubDomains;

  if(sts->expires != TIME_T_MAX) {
    result = Curl_gmtime((time_t)sts->expires, &stamp);
    if(result)
      return result;

    msnprintf(e.expire, sizeof(e.expire), "%d%02d%02d %02d:%02d:%02d",
              stamp.tm_year + 1900, stamp.tm_mon + 1, stamp.tm_mday,
              stamp.tm_hour, stamp.tm_min, stamp.tm_sec);
  }
  else
    strcpy(e.expire, UNLIMITED);

  sc = data->set.hsts_write(data, &e, i,
                            data->set.hsts_write_userp);
  *stop = (sc != CURLSTS_OK);
  return sc == CURLSTS_FAIL ? CURLE_BAD_FUNCTION_ARGUMENT : CURLE_OK;
}